

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displ.cpp
# Opt level: O0

void __thiscall displ::createWindow(displ *this,string *str,uint x,uint y,uint antialiasing)

{
  VideoMode mode;
  String *pSVar1;
  uint in_ECX;
  uint in_EDX;
  Window *in_RSI;
  String *in_RDI;
  uint in_R8D;
  ContextSettings settings;
  float y_00;
  float in_stack_ffffffffffffff1c;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Uint32 style;
  String *title;
  locale *in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  String *in_stack_ffffffffffffff70;
  locale local_70 [44];
  VideoMode local_44;
  ContextSettings local_38;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  uVar2 = 0;
  y_00 = 0.0;
  title = in_RDI;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  sf::ContextSettings::ContextSettings(&local_38,0,0,0,1,1,0,false);
  style = (Uint32)((ulong)in_RDI >> 0x20);
  local_38.antialiasingLevel = local_1c;
  sf::VideoMode::VideoMode(&local_44,local_14,local_18,0x20);
  std::locale::locale(local_70);
  sf::String::String(in_stack_ffffffffffffff70,
                     (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60);
  mode.height = local_44.width;
  mode.bitsPerPixel = local_44.height;
  mode.width = (uint)in_stack_ffffffffffffff6c;
  sf::Window::create(in_RSI,mode,title,style,
                     (ContextSettings *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  sf::String::~String((String *)0x1250b6);
  std::locale::~locale(local_70);
  pSVar1 = title + 0x10;
  sf::Rect<float>::Rect
            ((Rect<float> *)&stack0xffffffffffffff60,0.0,0.0,(float)local_14,(float)local_18);
  sf::View::reset((View *)((long)&(pSVar1->m_string).field_2 + 8),
                  (FloatRect *)&stack0xffffffffffffff60);
  sf::RenderTarget::setView
            ((RenderTarget *)CONCAT44(in_stack_ffffffffffffff24,uVar2),
             (View *)CONCAT44(in_stack_ffffffffffffff1c,y_00));
  sf::RenderTarget::clear
            ((RenderTarget *)CONCAT44(in_stack_ffffffffffffff24,uVar2),
             (Color *)CONCAT44(in_stack_ffffffffffffff1c,y_00));
  sf::Window::display(in_RSI);
  zoom((displ *)CONCAT44(in_stack_ffffffffffffff24,uVar2),in_stack_ffffffffffffff1c);
  vec2<float>::getX((vec2<float> *)((long)&title[0x16].m_string._M_dataplus._M_p + 4));
  vec2<float>::getY((vec2<float> *)((long)&title[0x16].m_string._M_dataplus._M_p + 4));
  setCenter((displ *)CONCAT44(in_stack_ffffffffffffff24,uVar2),in_stack_ffffffffffffff1c,y_00);
  return;
}

Assistant:

void displ::createWindow(std::string str, unsigned x, unsigned y, unsigned antialiasing)
{
	sf::ContextSettings settings;
	//Z antyaliasingiem 0 działa bardzo szybko ale brzydko
	settings.antialiasingLevel = antialiasing;
	window.create(sf::VideoMode(x,y), str,sf::Style::Default, settings);	
	
	view.reset(sf::FloatRect( 0, 0, x, y));
	window.setView(view);
	
	window.clear(sf::Color::Black);
	window.display();

	zoom(0.3f);
    setCenter(box.getX()/2.f, box.getY()/2.f);
}